

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<Fad<double>,_3>::TPZManVector
          (TPZManVector<Fad<double>,_3> *this,TPZVec<Fad<double>_> *copy)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  
  (this->super_TPZVec<Fad<double>_>).fStore = (Fad<double> *)0x0;
  (this->super_TPZVec<Fad<double>_>).fNElements = 0;
  (this->super_TPZVec<Fad<double>_>).fNAlloc = 0;
  (this->super_TPZVec<Fad<double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0187b378;
  pFVar8 = this->fExtAlloc;
  lVar5 = 0;
  pFVar7 = pFVar8;
  do {
    Fad<double>::Fad(pFVar7);
    lVar5 = lVar5 + -0x20;
    pFVar7 = pFVar7 + 1;
  } while (lVar5 != -0x60);
  uVar6 = copy->fNElements;
  if ((long)uVar6 < 4) {
    uVar4 = 0;
  }
  else {
    puVar3 = (ulong *)operator_new__(-(ulong)(uVar6 >> 0x3b != 0) | uVar6 * 0x20 | 8);
    *puVar3 = uVar6;
    pFVar8 = (Fad<double> *)(puVar3 + 1);
    lVar5 = 0;
    pFVar7 = pFVar8;
    do {
      Fad<double>::Fad(pFVar7);
      lVar5 = lVar5 + -0x20;
      pFVar7 = pFVar7 + 1;
      uVar4 = uVar6;
    } while (-lVar5 != uVar6 * 0x20);
  }
  (this->super_TPZVec<Fad<double>_>).fStore = pFVar8;
  (this->super_TPZVec<Fad<double>_>).fNElements = uVar6;
  (this->super_TPZVec<Fad<double>_>).fNAlloc = uVar4;
  if (0 < (long)uVar6) {
    lVar5 = 0;
    do {
      pFVar8 = copy->fStore;
      pFVar7 = (this->super_TPZVec<Fad<double>_>).fStore;
      puVar1 = (undefined8 *)((long)&pFVar8->val_ + lVar5);
      puVar2 = (undefined8 *)((long)&pFVar7->val_ + lVar5);
      *puVar2 = *puVar1;
      Vector<double>::operator=((Vector<double> *)(puVar2 + 1),(Vector<double> *)(puVar1 + 1));
      *(undefined8 *)((long)&pFVar7->defaultVal + lVar5) =
           *(undefined8 *)((long)&pFVar8->defaultVal + lVar5);
      lVar5 = lVar5 + 0x20;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(
        const TPZVec<T> & copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= (int64_t) (sizeof (fExtAlloc) / sizeof (T))) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy[i];
    }
}